

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegionsBuilder.cpp
# Opt level: O2

void __thiscall ThreadRegionsBuilder::visit(ThreadRegionsBuilder *this,Node *node)

{
  bool bVar1;
  ThreadRegion *pTVar2;
  ThreadRegion *threadRegion;
  ThreadRegionsBuilder *this_00;
  pair<std::__detail::_Node_iterator<std::pair<Node_*const,_ThreadRegion_*>,_false,_false>,_bool>
  pVar3;
  Node *successor;
  ThreadRegion *successorRegion;
  NodeIterator __begin1;
  NodeIterator __end1;
  Node *local_a0;
  ThreadRegion *local_98;
  Node *local_90;
  _Rb_tree<ThreadRegion*,ThreadRegion*,std::_Identity<ThreadRegion*>,std::less<ThreadRegion*>,std::allocator<ThreadRegion*>>
  *local_88;
  NodeIterator local_80;
  NodeIterator local_58;
  
  local_90 = node;
  Node::begin(&local_80,node);
  Node::end(&local_58,node);
  local_88 = (_Rb_tree<ThreadRegion*,ThreadRegion*,std::_Identity<ThreadRegion*>,std::less<ThreadRegion*>,std::allocator<ThreadRegion*>>
              *)&this->threadRegions_;
  while( true ) {
    bVar1 = NodeIterator::operator!=(&local_80,&local_58);
    if (!bVar1) break;
    local_a0 = NodeIterator::operator*(&local_80);
    bVar1 = visited(this,local_a0);
    if (!bVar1) {
      pTVar2 = region(this,local_a0);
      this_00 = this;
      bVar1 = examined(this,pTVar2);
      if (bVar1) {
        pTVar2 = region(this,node);
        threadRegion = region(this,local_a0);
        ThreadRegion::addSuccessor(pTVar2,threadRegion);
      }
      else {
        local_98 = (ThreadRegion *)0x0;
        bVar1 = shouldCreateNewRegion(this_00,node,local_a0);
        node = local_90;
        if (bVar1) {
          pTVar2 = (ThreadRegion *)operator_new(0xa0);
          ThreadRegion::ThreadRegion(pTVar2,local_a0);
          local_98 = pTVar2;
          std::
          _Rb_tree<ThreadRegion*,ThreadRegion*,std::_Identity<ThreadRegion*>,std::less<ThreadRegion*>,std::allocator<ThreadRegion*>>
          ::_M_insert_unique<ThreadRegion*const&>(local_88,&local_98);
          node = local_90;
          pTVar2 = region(this,local_90);
          ThreadRegion::addSuccessor(pTVar2,local_98);
        }
        else {
          local_98 = region(this,local_90);
        }
        std::
        _Hashtable<Node*,std::pair<Node*const,ThreadRegion*>,std::allocator<std::pair<Node*const,ThreadRegion*>>,std::__detail::_Select1st,std::equal_to<Node*>,std::hash<Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<Node*&,ThreadRegion*&>
                  ((_Hashtable<Node*,std::pair<Node*const,ThreadRegion*>,std::allocator<std::pair<Node*const,ThreadRegion*>>,std::__detail::_Select1st,std::equal_to<Node*>,std::hash<Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)this,&local_a0,&local_98);
        visit(this,local_a0);
      }
    }
    NodeIterator::operator++(&local_80);
  }
  local_80.forkNode = (ForkNode *)region(this,node);
  pVar3 = std::
          _Hashtable<Node*,std::pair<Node*const,ThreadRegion*>,std::allocator<std::pair<Node*const,ThreadRegion*>>,std::__detail::_Select1st,std::equal_to<Node*>,std::hash<Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<Node*&,ThreadRegion*>
                    ((_Hashtable<Node*,std::pair<Node*const,ThreadRegion*>,std::allocator<std::pair<Node*const,ThreadRegion*>>,std::__detail::_Select1st,std::equal_to<Node*>,std::hash<Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->examinedNodeToRegionMap,&local_90);
  std::
  _Hashtable<Node_*,_std::pair<Node_*const,_ThreadRegion_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>,_std::__detail::_Select1st,_std::equal_to<Node_*>,_std::hash<Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase((_Hashtable<Node_*,_std::pair<Node_*const,_ThreadRegion_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>,_std::__detail::_Select1st,_std::equal_to<Node_*>,_std::hash<Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)this,&local_90,pVar3._8_8_);
  return;
}

Assistant:

void ThreadRegionsBuilder::visit(Node *node) {
    for (auto *successor : *node) {
        if (visited(successor)) {
            continue;
        }
        if (examined(region(successor))) {
            region(node)->addSuccessor(region(successor));
        } else {
            ThreadRegion *successorRegion = nullptr;
            if (shouldCreateNewRegion(node, successor)) {
                successorRegion = new ThreadRegion(successor);
                threadRegions_.insert(successorRegion);
                region(node)->addSuccessor(successorRegion);
            } else {
                successorRegion = region(node);
            }
            this->visitedNodeToRegionMap.emplace(successor, successorRegion);
            visit(successor);
        }
    }
    this->examinedNodeToRegionMap.emplace(node, region(node));
    this->visitedNodeToRegionMap.erase(node);
}